

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedRotaryWingAircraft.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::GED_EnhancedRotaryWingAircraft::operator==
          (GED_EnhancedRotaryWingAircraft *this,GED_EnhancedRotaryWingAircraft *Value)

{
  KBOOL KVar1;
  
  KVar1 = GED_BasicRotorWingAircraft::operator!=
                    (&this->super_GED_BasicRotorWingAircraft,
                     &Value->super_GED_BasicRotorWingAircraft);
  if ((((KVar1) ||
       ((this->super_GED_BasicRotorWingAircraft).field_0x2c !=
        (Value->super_GED_BasicRotorWingAircraft).field_0x2c)) ||
      ((this->super_GED_BasicRotorWingAircraft).field_0x2d !=
       (Value->super_GED_BasicRotorWingAircraft).field_0x2d)) ||
     ((this->super_GED_BasicRotorWingAircraft).field_0x2e !=
      (Value->super_GED_BasicRotorWingAircraft).field_0x2e)) {
    KVar1 = false;
  }
  else {
    KVar1 = (this->super_GED_BasicRotorWingAircraft).field_0x2f ==
            (Value->super_GED_BasicRotorWingAircraft).field_0x2f;
  }
  return KVar1;
}

Assistant:

KBOOL GED_EnhancedRotaryWingAircraft::operator == ( const GED_EnhancedRotaryWingAircraft & Value ) const
{
    if( GED_BasicRotorWingAircraft::operator!=( Value ) )  return false;
    if( m_ui8SupFuelStatus  != Value.m_ui8SupFuelStatus )  return false;
    if( m_ui8AirMaintStatus != Value.m_ui8AirMaintStatus ) return false;
    if( m_ui8PriAmmun       != Value.m_ui8PriAmmun )       return false;
    if( m_ui8SecAmmun       != Value.m_ui8SecAmmun )       return false;
    return true;
}